

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

int __thiscall
glcts::TextureCubeMapArraySamplingTest::bufferDefinition::init
          (bufferDefinition *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  void *in_RCX;
  GLsizeiptr in_RDX;
  GLvoid *buffer_data_local;
  GLsizeiptr buffer_size_local;
  Functions *gl_local;
  bufferDefinition *this_local;
  
  this->m_gl = (Functions *)ctx;
  (*this->m_gl->genBuffers)(1,&this->m_buffer_object_id);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"Failed to generate buffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x1050);
  (*this->m_gl->bindBuffer)(0x8892,this->m_buffer_object_id);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"Failed to bind buffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x1053);
  (*this->m_gl->bufferData)(0x8892,in_RDX,in_RCX,0x88e4);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"Failed to update buffer\'s data.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x1056);
  (*this->m_gl->bindBuffer)(0x8892,0);
  GVar1 = (*this->m_gl->getError)();
  return GVar1;
}

Assistant:

void TextureCubeMapArraySamplingTest::bufferDefinition::init(const glw::Functions& gl, glw::GLsizeiptr buffer_size,
															 glw::GLvoid* buffer_data)
{
	m_gl = &gl;

	m_gl->genBuffers(1, &m_buffer_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to generate buffer.");

	m_gl->bindBuffer(GL_ARRAY_BUFFER, m_buffer_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to bind buffer.");

	m_gl->bufferData(GL_ARRAY_BUFFER, buffer_size, buffer_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to update buffer's data.");

	m_gl->bindBuffer(GL_ARRAY_BUFFER, 0);
	m_gl->getError();
}